

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O2

void __thiscall
cfg::tag_vector_t<cfgfile::string_trait_t>::tag_vector_t
          (tag_vector_t<cfgfile::string_trait_t> *this,vector_t *cfg)

{
  allocator local_59;
  string local_58 [32];
  string_t local_38;
  
  std::__cxx11::string::string(local_58,"vector",&local_59);
  std::__cxx11::string::string((string *)&local_38,local_58);
  cfgfile::tag_no_value_t<cfgfile::string_trait_t>::tag_no_value_t
            (&this->super_tag_no_value_t<cfgfile::string_trait_t>,&local_38,true);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string(local_58);
  (this->super_tag_no_value_t<cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
  _vptr_tag_t = (_func_int **)&PTR__tag_vector_t_00138608;
  std::__cxx11::string::string(local_58,"vector",&local_59);
  std::__cxx11::string::string((string *)&local_38,local_58);
  cfgfile::tag_vector_of_tags_t<cfg::tag_tags_t<cfgfile::string_trait_t>,_cfgfile::string_trait_t>::
  tag_vector_of_tags_t(&this->m_vector,(tag_t<cfgfile::string_trait_t> *)this,&local_38,true);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string(local_58);
  set_cfg(this,cfg);
  return;
}

Assistant:

explicit tag_vector_t( const vector_t & cfg )
		:	cfgfile::tag_no_value_t< Trait >( Trait::from_ascii( "vector" ), true )
		,	m_vector( *this, Trait::from_ascii( "vector" ), true )
	{
		set_cfg( cfg );
	}